

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O1

void __thiscall cppcms::url_mapper::url_mapper(url_mapper *this,application *my_app)

{
  _Rb_tree_header *p_Var1;
  data *pdVar2;
  service *this_00;
  cached_settings *pcVar3;
  
  pdVar2 = (data *)operator_new(0xb8);
  pdVar2->throws = true;
  (pdVar2->this_name)._M_dataplus._M_p = (pointer)&(pdVar2->this_name).field_2;
  (pdVar2->this_name)._M_string_length = 0;
  (pdVar2->this_name).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(pdVar2->by_key)._M_t._M_impl.super__Rb_tree_header;
  (pdVar2->by_key)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pdVar2->by_key)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pdVar2->parent = (application *)0x0;
  pdVar2->this_application = (application *)0x0;
  (pdVar2->by_key)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pdVar2->by_key)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pdVar2->by_key)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(pdVar2->helpers)._M_t._M_impl.super__Rb_tree_header;
  (pdVar2->helpers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pdVar2->helpers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pdVar2->helpers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pdVar2->helpers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pdVar2->helpers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pdVar2->root)._M_dataplus._M_p = (pointer)&(pdVar2->root).field_2;
  (pdVar2->root)._M_string_length = 0;
  (pdVar2->root).field_2._M_local_buf[0] = '\0';
  (this->d).ptr_ = pdVar2;
  pdVar2->this_application = my_app;
  this_00 = application::service(my_app);
  pcVar3 = service::cached_settings(this_00);
  ((this->d).ptr_)->throws = (pcVar3->misc).invalid_url_throws;
  return;
}

Assistant:

url_mapper::url_mapper(cppcms::application *my_app) : d(new url_mapper::data())
	{
		d->this_application = my_app;
		d->throws = my_app->service().cached_settings().misc.invalid_url_throws;
	}